

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall EthBasePort::OptimizeFirewireGapCount(EthBasePort *this)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  byte local_26;
  uint local_24;
  uchar gap_count_new;
  uchar gap_count;
  uint node;
  uchar gap_count_max;
  uchar gap_count_min;
  EthBasePort *pEStack_18;
  quadlet_t data;
  EthBasePort *this_local;
  
  node = 1;
  pEStack_18 = this;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,1,0);
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "OptimizeFirewireGapCount: failed to broadcast PHY command");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    gap_count = '?';
    gap_count_new = '\0';
    for (local_24 = 0; local_24 < (this->super_BasePort).NumOfNodes_; local_24 = local_24 + 1) {
      uVar2 = (*(this->super_BasePort)._vptr_BasePort[4])(this,(ulong)(ushort)local_24,2,&node);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      bVar1 = (byte)node & 0x3f;
      if (bVar1 < gap_count) {
        gap_count = bVar1;
      }
      if (gap_count_new < bVar1) {
        gap_count_new = bVar1;
      }
    }
    if (gap_count == gap_count_new) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "OptimizeFirewireGapCount: current gap count is ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)gap_count);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (gap_count != gap_count_new) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "OptimizeFirewireGapCount: inconsistent gap counts (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)gap_count);
      poVar3 = std::operator<<(poVar3,"-");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)gap_count_new);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if ((gap_count != gap_count_new) || (gap_count == '?')) {
      local_26 = 0x3f;
      if ((this->super_BasePort).NumOfNodes_ < 0x19) {
        local_26 = gap_counts[(this->super_BasePort).NumOfNodes_];
      }
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "OptimizeFirewireGapCount: updating gap count to ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_26);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      node = local_26 | 0x1100;
      uVar2 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,(ulong)node,0);
      if ((uVar2 & 1) == 0) {
        poVar3 = std::operator<<((this->super_BasePort).outStr,
                                 "OptimizeFirewireGapCount: failed to broadcast PHY command");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::OptimizeFirewireGapCount()
{
    // Broadcast to all boards to initiate read of PHY register 1
    quadlet_t data = 1;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
        outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
        return false;
    }
    // Now, read each node to get the gap count
    unsigned char gap_count_min = gap_count_default;
    unsigned char gap_count_max = 0;
    for (unsigned int node = 0; node < NumOfNodes_; node++) {
        if (!ReadQuadletNode(node, BoardIO::FW_PHY_RESP, data))
            return false;
        unsigned char gap_count = static_cast<unsigned char>(data) & 0x3f;
        if (gap_count < gap_count_min)
            gap_count_min = gap_count;
        if (gap_count > gap_count_max)
            gap_count_max = gap_count;
    }
    if (gap_count_min == gap_count_max) {
        std::cout << "OptimizeFirewireGapCount: current gap count is "
                  << static_cast<unsigned int>(gap_count_min) << std::endl;
    }
    else if (gap_count_min != gap_count_max)
        std::cout << "OptimizeFirewireGapCount: inconsistent gap counts ("
                  << static_cast<unsigned int>(gap_count_min) << "-"
                  << static_cast<unsigned int>(gap_count_max) << ")" << std::endl;
    // Update the gap count if it is inconsistent, or if the gap count is the default value of 63,
    // which would indicate that it has not yet been set (e.g., there is PC connected via Firewire).
    if ((gap_count_min != gap_count_max) || (gap_count_min == gap_count_default)) {
        unsigned char gap_count_new = gap_count_default;
        if (NumOfNodes_ < 25)
            gap_count_new = gap_counts[NumOfNodes_];
        std::cout << "OptimizeFirewireGapCount: updating gap count to "
                  << static_cast<unsigned int>(gap_count_new) << std::endl;
        // Set bit 12 to indicate write; addr (1) in bits 11-8, data (gap_count) in bits 7-0
        data = 0x00001100 | static_cast<quadlet_t>(gap_count_new);
        if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
            outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
            return false;
        }
    }
    return true;
}